

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_smart_pointers.cpp
# Opt level: O2

void __thiscall L16_1::Report::~Report(Report *this)

{
  std::operator<<((ostream *)&std::cout,"Object deleted...\n");
}

Assistant:

~Report() {
            cout << "Object deleted...\n";
        }